

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
CDBWrapper::CreateObfuscateKey
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          CDBWrapper *this)

{
  long lVar1;
  value_type *__val;
  pointer puVar2;
  long in_FS_OFFSET;
  Span<unsigned_char> bytes;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (pointer)operator_new(8);
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = puVar2;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = puVar2 + 8;
  puVar2[0] = '\0';
  puVar2[1] = '\0';
  puVar2[2] = '\0';
  puVar2[3] = '\0';
  puVar2[4] = '\0';
  puVar2[5] = '\0';
  puVar2[6] = '\0';
  puVar2[7] = '\0';
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = puVar2 + 8;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    bytes.m_size = 8;
    bytes.m_data = puVar2;
    GetRandBytes(bytes);
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<unsigned char> CDBWrapper::CreateObfuscateKey() const
{
    std::vector<uint8_t> ret(OBFUSCATE_KEY_NUM_BYTES);
    GetRandBytes(ret);
    return ret;
}